

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

bool __thiscall crnlib::dynamic_string::set_len(dynamic_string *this,uint new_len,char fill_char)

{
  bool bVar1;
  uint uVar2;
  byte in_DL;
  uint in_ESI;
  dynamic_string *in_RDI;
  uint cur_len;
  bool local_1;
  
  if ((in_ESI < 0xffff) && ((bool)in_DL != false)) {
    uVar2 = (uint)in_RDI->m_len;
    bVar1 = ensure_buf(in_RDI,in_ESI,(bool)in_DL);
    if (bVar1) {
      if (uVar2 < in_ESI) {
        memset(in_RDI->m_pStr + uVar2,(uint)in_DL,(ulong)(in_ESI - uVar2));
      }
      in_RDI->m_pStr[in_ESI] = '\0';
      in_RDI->m_len = (uint16)in_ESI;
      check(in_RDI);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool dynamic_string::set_len(uint new_len, char fill_char) {
  if ((new_len >= cUINT16_MAX) || (!fill_char)) {
    CRNLIB_ASSERT(0);
    return false;
  }

  uint cur_len = m_len;

  if (ensure_buf(new_len, true)) {
    if (new_len > cur_len)
      memset(m_pStr + cur_len, fill_char, new_len - cur_len);

    m_pStr[new_len] = 0;

    m_len = static_cast<uint16>(new_len);

    check();
  }

  return true;
}